

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_roi_resize
                (uchar *pixels,int type,int w,int h,int roix,int roiy,int roiw,int roih,
                int target_width,int target_height,Allocator *allocator)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  Mat *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int type_from;
  int in_stack_00000148;
  int in_stack_0000014c;
  int in_stack_00000150;
  int in_stack_00000154;
  uchar *in_stack_00000158;
  int in_stack_00000170;
  int in_stack_00000178;
  Allocator *in_stack_00000180;
  
  if ((((((int)in_R9D < 0) || ((int)in_stack_00000008 < 0)) || ((int)in_stack_00000010 < 1)) ||
      (((int)in_stack_00000018 < 1 || (in_ECX < (int)(in_R9D + in_stack_00000010))))) ||
     (in_R8D < (int)(in_stack_00000008 + in_stack_00000018))) {
    fprintf(_stderr,"roi %d %d %d %d out of image %d %d",(ulong)in_R9D,(ulong)in_stack_00000008,
            (ulong)in_stack_00000010,(ulong)in_stack_00000018);
    fprintf(_stderr,"\n");
    Mat(in_RDI);
  }
  else {
    uVar1 = in_EDX & 0xffff;
    if ((uVar1 == 1) || (uVar1 == 2)) {
      from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                         in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
    }
    else if (uVar1 == 3) {
      from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                         in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
    }
    else if ((uVar1 == 4) || (uVar1 == 5)) {
      from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                         in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
    }
    else {
      fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
      fprintf(_stderr,"\n");
      Mat(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_roi_resize(const unsigned char* pixels, int type, int w, int h, int roix, int roiy, int roiw, int roih, int target_width, int target_height, Allocator* allocator)
{
    if (roix < 0 || roiy < 0 || roiw <= 0 || roih <= 0 || roix + roiw > w || roiy + roih > h)
    {
        NCNN_LOGE("roi %d %d %d %d out of image %d %d", roix, roiy, roiw, roih, w, h);
        return Mat();
    }

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return from_pixels_resize(pixels + (roiy * w + roix) * 3, type, roiw, roih, w * 3, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return from_pixels_resize(pixels + (roiy * w + roix) * 1, type, roiw, roih, w * 1, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return from_pixels_resize(pixels + (roiy * w + roix) * 4, type, roiw, roih, w * 4, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}